

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::TypeSCCs::~TypeSCCs(TypeSCCs *this)

{
  _Hash_node_base *p_Var1;
  __buckets_ptr pp_Var2;
  pointer pHVar3;
  pointer pWVar4;
  _Hash_node_base *p_Var5;
  
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->includedTypes)._M_h);
  p_Var5 = (this->
           super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
           ).elementInfo._M_h._M_before_begin._M_nxt;
  while (p_Var5 != (_Hash_node_base *)0x0) {
    p_Var1 = p_Var5->_M_nxt;
    operator_delete(p_Var5,0x30);
    p_Var5 = p_Var1;
  }
  memset((this->
         super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
         ).elementInfo._M_h._M_buckets,0,
         (this->
         super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
         ).elementInfo._M_h._M_bucket_count << 3);
  (this->
  super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  ).elementInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->
  super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  ).elementInfo._M_h._M_element_count = 0;
  pp_Var2 = (this->
            super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
            ).elementInfo._M_h._M_buckets;
  if (&(this->
       super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
       ).elementInfo._M_h._M_single_bucket != pp_Var2) {
    operator_delete(pp_Var2,(this->
                            super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                            ).elementInfo._M_h._M_bucket_count << 3);
  }
  pHVar3 = (this->
           super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
           ).stack.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar3 != (pointer)0x0) {
    operator_delete(pHVar3,(long)(this->
                                 super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                                 ).stack.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar3);
  }
  pWVar4 = (this->
           super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
           ).workStack.
           super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pWVar4 == (pointer)0x0) {
    return;
  }
  operator_delete(pWVar4,(long)(this->
                               super_SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                               ).workStack.
                               super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pWVar4);
  return;
}

Assistant:

TypeSCCs(const std::vector<HeapType>& types)
    : SCCs(types.begin(), types.end()),
      includedTypes(types.cbegin(), types.cend()) {}